

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferTextureBufferRange::getComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  ostream *poVar1;
  stringstream result;
  char *local_220 [4];
  char *local_200 [4];
  char *local_1e0 [4];
  char *local_1c0 [4];
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(&local_190,
                           "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nlayout("
                          );
  std::__cxx11::string::string((string *)local_1c0,(string *)&info->m_image_format_name);
  poVar1 = std::operator<<(poVar1,local_1c0[0]);
  poVar1 = std::operator<<(poVar1,", binding = 0) uniform highp readonly ");
  std::__cxx11::string::string((string *)local_1e0,(string *)&info->m_image_type_name);
  poVar1 = std::operator<<(poVar1,local_1e0[0]);
  poVar1 = std::operator<<(poVar1,
                           " image_buffer;\n\nlayout(binding = 0 ) buffer ComputeSSBOSize\n{\n    int outImageSize;\n} computeSSBOSize;\nlayout(binding = 1 ) buffer ComputeSSBOSizeValue\n{\n    "
                          );
  std::__cxx11::string::string((string *)local_200,(string *)&info->m_output_type_name);
  poVar1 = std::operator<<(poVar1,local_200[0]);
  poVar1 = std::operator<<(poVar1,
                           " outValue;\n} computeSSBOValue;\n\nlayout (local_size_x = 1 ) in;\n\nvoid main(void)\n{\n    computeSSBOValue.outValue    = imageLoad( image_buffer, 0)"
                          );
  std::__cxx11::string::string((string *)local_220,(string *)&info->m_value_selector);
  poVar1 = std::operator<<(poVar1,local_220[0]);
  std::operator<<(poVar1,";\n    computeSSBOSize.outImageSize = imageSize( image_buffer );\n}\n");
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getComputeShaderCode(FormatInfo& info) const
{
	std::stringstream result;

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "layout("
		   << info.get_image_format_name().c_str() << ", binding = 0) uniform highp readonly "
		   << info.get_image_type_name().c_str() << " image_buffer;\n"
													"\n"
													"layout(binding = 0 ) buffer ComputeSSBOSize\n"
													"{\n"
													"    int outImageSize;\n"
													"} computeSSBOSize;\n"
													"layout(binding = 1 ) buffer ComputeSSBOSizeValue\n"
													"{\n"
													"    "
		   << info.get_output_type_name().c_str() << " outValue;\n"
													 "} computeSSBOValue;\n"
													 "\n"
													 "layout (local_size_x = 1 ) in;\n"
													 "\n"
													 "void main(void)\n"
													 "{\n"
													 "    computeSSBOValue.outValue    = imageLoad( image_buffer, 0)"
		   << info.get_value_selector().c_str() << ";\n"
												   "    computeSSBOSize.outImageSize = imageSize( image_buffer );\n"
												   "}\n";

	return result.str();
}